

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int run_array_container_andnot(run_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  rle16_t *prVar4;
  ushort *puVar5;
  rle16_t *prVar6;
  uint16_t *puVar7;
  uint16_t *puVar8;
  uint uVar9;
  _Bool _Var10;
  uint uVar11;
  run_container_t *prVar12;
  array_container_t *paVar13;
  bitset_container_t *src_1_00;
  run_container_t *prVar14;
  ushort uVar15;
  int32_t n_runs;
  long lVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  int32_t iVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  uint8_t return_type;
  byte local_3d [5];
  container_t **local_38;
  
  uVar11 = croaring_hardware_support();
  if ((uVar11 & 2) == 0) {
    uVar11 = croaring_hardware_support();
    if ((uVar11 & 1) == 0) {
      uVar11 = src_1->n_runs;
      lVar16 = (long)(int)uVar11;
      if (lVar16 < 1) goto LAB_00113e78;
      lVar19 = 0;
      do {
        uVar11 = uVar11 + src_1->runs[lVar19].length;
        lVar19 = lVar19 + 1;
      } while (lVar16 != lVar19);
    }
    else {
      uVar11 = _avx2_run_container_cardinality(src_1);
    }
  }
  else {
    uVar11 = _avx512_run_container_cardinality(src_1);
  }
  if (0x20 < (int)uVar11) {
    if (0x1000 < uVar11) {
      src_1_00 = bitset_container_from_run(src_1);
      _Var10 = bitset_array_container_iandnot(src_1_00,src_2,dst);
      return 2 - (uint)_Var10;
    }
    local_38 = dst;
    paVar13 = array_container_create_given_capacity(uVar11);
    iVar3 = src_1->n_runs;
    if ((long)iVar3 < 1) {
      iVar22 = 0;
    }
    else {
      prVar4 = src_1->runs;
      puVar7 = src_2->array;
      iVar21 = src_2->cardinality;
      iVar25 = -1;
      lVar16 = 0;
      iVar22 = 0;
      do {
        uVar15 = prVar4[lVar16].value;
        uVar11 = (uint)uVar15;
        uVar1 = prVar4[lVar16].length;
        iVar24 = iVar25 + 1;
        iVar26 = iVar24;
        if ((iVar24 < iVar21) && (puVar7[iVar24] < uVar15)) {
          iVar26 = iVar25 + 2;
          iVar17 = 1;
          if (iVar26 < iVar21) {
            iVar17 = 1;
            do {
              uVar2 = puVar7[iVar26];
              if (uVar15 <= uVar2) goto LAB_00114000;
              iVar25 = iVar17 * 2;
              iVar26 = iVar24 + iVar17 * 2;
              iVar17 = iVar25;
            } while (iVar26 < iVar21);
          }
          uVar2 = puVar7[(long)iVar21 + -1];
          iVar26 = iVar21 + -1;
LAB_00114000:
          if (uVar2 == uVar15) goto LAB_0011400d;
          iVar25 = iVar21;
          if (uVar15 <= uVar2) {
            if (iVar24 + (iVar17 >> 1) + 1 != iVar26) {
              iVar24 = (iVar17 >> 1) + iVar24;
              iVar25 = iVar26;
              do {
                iVar26 = iVar24 + iVar25 >> 1;
                if (puVar7[iVar26] == uVar15) break;
                iVar17 = iVar26;
                if (puVar7[iVar26] < uVar15) {
                  iVar17 = iVar25;
                  iVar24 = iVar26;
                }
                iVar26 = iVar17;
                iVar25 = iVar26;
              } while (iVar24 + 1 != iVar26);
            }
            goto LAB_0011400d;
          }
LAB_00114051:
          puVar8 = paVar13->array;
          lVar19 = 0;
          do {
            puVar8[iVar22 + lVar19] = uVar15 + (short)lVar19;
            lVar19 = lVar19 + 1;
          } while (uVar1 + 1 != (int)lVar19);
          iVar22 = iVar22 + (int)lVar19;
        }
        else {
LAB_0011400d:
          iVar25 = iVar26;
          if (iVar21 <= iVar26) goto LAB_00114051;
          uVar18 = (uint)puVar7[iVar26];
          if ((uint)uVar1 + (uint)uVar15 < (uint)puVar7[iVar26]) {
            puVar8 = paVar13->array;
            lVar19 = 0;
            do {
              puVar8[iVar22 + lVar19] = uVar15 + (short)lVar19;
              lVar19 = lVar19 + 1;
            } while (uVar1 + 1 != (int)lVar19);
            iVar22 = iVar22 + (int)lVar19;
          }
          else {
            iVar25 = uVar1 + 1;
            do {
              if (uVar11 == uVar18) {
                iVar24 = iVar26 + 1;
                if (iVar24 < iVar21) {
                  uVar18 = (uint)puVar7[iVar24];
                  iVar26 = iVar24;
                }
                else {
                  uVar18 = 0;
                }
              }
              else {
                lVar19 = (long)iVar22;
                iVar22 = iVar22 + 1;
                paVar13->array[lVar19] = (uint16_t)uVar11;
              }
              uVar11 = uVar11 + 1;
              iVar25 = iVar25 + -1;
            } while (iVar25 != 0);
          }
          iVar25 = iVar26 + -1;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != iVar3);
    }
    paVar13->cardinality = iVar22;
    *local_38 = paVar13;
    return 2;
  }
LAB_00113e78:
  if (src_2->cardinality == 0) {
    prVar12 = run_container_clone(src_1);
    *dst = prVar12;
    uVar11 = 3;
  }
  else {
    prVar12 = run_container_create_given_capacity(src_2->cardinality + uVar11);
    iVar22 = src_1->n_runs;
    if (0 < iVar22) {
      prVar4 = src_1->runs;
      puVar5 = src_2->array;
      uVar18 = (uint)*puVar5;
      uVar11 = (uint)prVar4->value;
      uVar20 = (uint)prVar4->length + (uint)prVar4->value + 1;
      iVar3 = src_2->cardinality;
      uVar23 = 0;
      iVar21 = 0;
      do {
        uVar15 = (ushort)uVar11;
        if (iVar3 <= iVar21) {
          prVar6 = prVar12->runs;
          lVar16 = (long)prVar12->n_runs;
          prVar12->n_runs = (int32_t)(lVar16 + 1);
          prVar6[lVar16].value = uVar15;
          prVar6[lVar16].length = (short)uVar20 + ~uVar15;
          iVar3 = uVar23 + 1;
          iVar21 = src_1->n_runs - iVar3;
          if (iVar21 != 0 && iVar3 <= src_1->n_runs) {
            memcpy(prVar6 + lVar16 + 1,prVar4 + iVar3,(long)iVar21 << 2);
            prVar12->n_runs = prVar12->n_runs + ~uVar23 + src_1->n_runs;
          }
          break;
        }
        uVar9 = uVar11;
        if (uVar18 < uVar20) {
          if (uVar18 < uVar11) {
            iVar21 = iVar21 + 1;
            if (iVar21 < iVar3) {
              uVar18 = (uint)puVar5[iVar21];
            }
          }
          else {
            if (uVar11 < uVar18) {
              prVar6 = prVar12->runs;
              iVar25 = prVar12->n_runs;
              prVar12->n_runs = iVar25 + 1;
              prVar6[iVar25].value = uVar15;
              prVar6[iVar25].length = ~uVar15 + (short)uVar18;
              iVar22 = src_1->n_runs;
            }
            uVar9 = uVar18 + 1;
            if (uVar20 <= uVar18 + 1) goto LAB_00113f02;
          }
        }
        else {
          prVar6 = prVar12->runs;
          iVar25 = prVar12->n_runs;
          prVar12->n_runs = iVar25 + 1;
          prVar6[iVar25].value = uVar15;
          prVar6[iVar25].length = ~uVar15 + (short)uVar20;
          iVar22 = src_1->n_runs;
LAB_00113f02:
          uVar23 = uVar23 + 1;
          uVar9 = uVar11;
          if ((int)uVar23 < iVar22) {
            uVar20 = (uint)prVar4[(int)uVar23].length + (uint)prVar4[(int)uVar23].value + 1;
            uVar9 = (uint)prVar4[(int)uVar23].value;
          }
        }
        uVar11 = uVar9;
      } while ((int)uVar23 < iVar22);
    }
    prVar14 = (run_container_t *)convert_run_to_efficient_container(prVar12,local_3d);
    *dst = prVar14;
    if (prVar12 != (run_container_t *)0x0 && prVar12 != prVar14) {
      (*global_memory_hook.free)(prVar12->runs);
      (*global_memory_hook.free)(prVar12);
    }
    uVar11 = (uint)local_3d[0];
  }
  return uVar11;
}

Assistant:

int run_array_container_andnot(const run_container_t *src_1,
                               const array_container_t *src_2,
                               container_t **dst) {
    // follows the Java impl as of June 2016

    int card = run_container_cardinality(src_1);
    const int arbitrary_threshold = 32;

    if (card <= arbitrary_threshold) {
        if (src_2->cardinality == 0) {
            *dst = run_container_clone(src_1);
            return RUN_CONTAINER_TYPE;
        }
        // Java's "lazyandNot.toEfficientContainer" thing
        run_container_t *answer = run_container_create_given_capacity(
            card + array_container_cardinality(src_2));

        int rlepos = 0;
        int xrlepos = 0;  // "x" is src_2
        rle16_t rle = src_1->runs[rlepos];
        int32_t start = rle.value;
        int32_t end = start + rle.length + 1;
        int32_t xstart = src_2->array[xrlepos];

        while ((rlepos < src_1->n_runs) && (xrlepos < src_2->cardinality)) {
            if (end <= xstart) {
                // output the first run
                answer->runs[answer->n_runs++] =
                    CROARING_MAKE_RLE16(start, end - start - 1);
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
            } else if (xstart + 1 <= start) {
                // exit the second run
                xrlepos++;
                if (xrlepos < src_2->cardinality) {
                    xstart = src_2->array[xrlepos];
                }
            } else {
                if (start < xstart) {
                    answer->runs[answer->n_runs++] =
                        CROARING_MAKE_RLE16(start, xstart - start - 1);
                }
                if (xstart + 1 < end) {
                    start = xstart + 1;
                } else {
                    rlepos++;
                    if (rlepos < src_1->n_runs) {
                        start = src_1->runs[rlepos].value;
                        end = start + src_1->runs[rlepos].length + 1;
                    }
                }
            }
        }
        if (rlepos < src_1->n_runs) {
            answer->runs[answer->n_runs++] =
                CROARING_MAKE_RLE16(start, end - start - 1);
            rlepos++;
            if (rlepos < src_1->n_runs) {
                memcpy(answer->runs + answer->n_runs, src_1->runs + rlepos,
                       (src_1->n_runs - rlepos) * sizeof(rle16_t));
                answer->n_runs += (src_1->n_runs - rlepos);
            }
        }
        uint8_t return_type;
        *dst = convert_run_to_efficient_container(answer, &return_type);
        if (answer != *dst) run_container_free(answer);
        return return_type;
    }
    // else it's a bitmap or array

    if (card <= DEFAULT_MAX_SIZE) {
        array_container_t *ac = array_container_create_given_capacity(card);
        // nb Java code used a generic iterator-based merge to compute
        // difference
        ac->cardinality = run_array_array_subtract(src_1, src_2, ac);
        *dst = ac;
        return ARRAY_CONTAINER_TYPE;
    }
    bitset_container_t *ans = bitset_container_from_run(src_1);
    bool result_is_bitset = bitset_array_container_iandnot(ans, src_2, dst);
    return (result_is_bitset ? BITSET_CONTAINER_TYPE : ARRAY_CONTAINER_TYPE);
}